

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_vdf.c
# Opt level: O3

void * VDF_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  PHYSFS_uint32 count;
  PHYSFS_uint32 dostime;
  void *arc;
  PHYSFS_sint64 ts;
  PHYSFS_ErrorCode errcode;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PHYSFS_uint32 version;
  PHYSFS_uint32 rootCatOffset;
  PHYSFS_uint8 sig [16];
  PHYSFS_uint8 ignore [16];
  PHYSFS_uint32 local_50;
  PHYSFS_uint32 local_4c;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  PHYSFS_uint32 local_38 [6];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_vdf.c"
                  ,0x68,"void *VDF_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = (*io->seek)(io,0x100);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    iVar1 = __PHYSFS_readAll(io,&local_48,0x10);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    auVar2[0] = -(local_48 == 'P');
    auVar2[1] = -(cStack_47 == 'S');
    auVar2[2] = -(cStack_46 == 'V');
    auVar2[3] = -(cStack_45 == 'D');
    auVar2[4] = -(cStack_44 == 'S');
    auVar2[5] = -(cStack_43 == 'C');
    auVar2[6] = -(cStack_42 == '_');
    auVar2[7] = -(cStack_41 == 'V');
    auVar2[8] = -(cStack_40 == '2');
    auVar2[9] = -(cStack_3f == '.');
    auVar2[10] = -(cStack_3e == '0');
    auVar2[0xb] = -(cStack_3d == '0');
    auVar2[0xc] = -(cStack_3c == '\r');
    auVar2[0xd] = -(cStack_3b == '\n');
    auVar2[0xe] = -(cStack_3a == '\r');
    auVar2[0xf] = -(cStack_39 == '\n');
    if (((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
         == 0xffff) ||
       (auVar3[0] = -(local_48 == 'P'), auVar3[1] = -(cStack_47 == 'S'),
       auVar3[2] = -(cStack_46 == 'V'), auVar3[3] = -(cStack_45 == 'D'),
       auVar3[4] = -(cStack_44 == 'S'), auVar3[5] = -(cStack_43 == 'C'),
       auVar3[6] = -(cStack_42 == '_'), auVar3[7] = -(cStack_41 == 'V'),
       auVar3[8] = -(cStack_40 == '2'), auVar3[9] = -(cStack_3f == '.'),
       auVar3[10] = -(cStack_3e == '0'), auVar3[0xb] = -(cStack_3d == '0'),
       auVar3[0xc] = -(cStack_3c == '\n'), auVar3[0xd] = -(cStack_3b == '\r'),
       auVar3[0xe] = -(cStack_3a == '\n'), auVar3[0xf] = -(cStack_39 == '\r'),
       (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
       == 0xffff)) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,local_38,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE32(local_38[0]);
      iVar1 = __PHYSFS_readAll(io,local_38,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = __PHYSFS_readAll(io,&local_50,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      dostime = PHYSFS_swapULE32(local_50);
      iVar1 = __PHYSFS_readAll(io,&local_50,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      PHYSFS_swapULE32(local_50);
      iVar1 = readui32(io,&local_4c);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = readui32(io,&local_50);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      if (local_50 == 0x50) {
        iVar1 = (*io->seek)(io,(PHYSFS_uint64)local_4c);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        arc = UNPK_openArchive(io);
        if (arc == (void *)0x0) {
          return (void *)0x0;
        }
        ts = vdfDosTimeToEpoch(dostime);
        iVar1 = vdfLoadEntries(io,count,ts,arc);
        if (iVar1 == 0) {
          UNPK_abandonArchive(arc);
          return (void *)0x0;
        }
        return arc;
      }
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *VDF_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 ignore[16];
    PHYSFS_uint8 sig[VDF_SIGNATURE_LENGTH];
    PHYSFS_uint32 count, timestamp, version, dataSize, rootCatOffset;
    void *unpkarc;

    assert(io != NULL); /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    /* skip the 256-byte comment field. */
    BAIL_IF_ERRPASS(!io->seek(io, VDF_COMMENT_LENGTH), NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, sig, sizeof (sig)), NULL);

    if ((memcmp(sig, VDF_SIGNATURE_G1, VDF_SIGNATURE_LENGTH) != 0) &&
        (memcmp(sig, VDF_SIGNATURE_G2, VDF_SIGNATURE_LENGTH) != 0))
    {
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);
    } /* if */

    *claimed = 1;

    BAIL_IF_ERRPASS(!readui32(io, &count), NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), NULL);  /* numFiles */
    BAIL_IF_ERRPASS(!readui32(io, &timestamp), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &dataSize), NULL);  /* dataSize */
    BAIL_IF_ERRPASS(!readui32(io, &rootCatOffset), NULL);  /* rootCatOff */
    BAIL_IF_ERRPASS(!readui32(io, &version), NULL);

    BAIL_IF(version != 0x50, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!io->seek(io, rootCatOffset), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!vdfLoadEntries(io, count, vdfDosTimeToEpoch(timestamp), unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}